

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteAttribute(xmlTextWriterPtr writer,xmlChar *name,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  iVar1 = xmlTextWriterStartAttribute(writer,name);
  if (iVar1 < 0) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar2 = xmlTextWriterWriteString(writer,content);
    if (iVar2 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar3 = xmlTextWriterEndAttribute(writer);
      if (iVar3 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        writer_local._4_4_ = iVar3 + iVar2 + iVar1;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteAttribute(xmlTextWriterPtr writer, const xmlChar * name,
                            const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartAttribute(writer, name);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterEndAttribute(writer);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}